

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O3

void __thiscall
ApprovalTests::ApprovalTestsCppUTestPlugin::preTestAction
          (ApprovalTestsCppUTestPlugin *this,UtestShell *shell,TestResult *result)

{
  unique_ptr<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_> *this_00;
  TestName *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_ApprovalTests::TestName_*,_false> _Var2;
  char *pcVar3;
  allocator local_79;
  undefined1 local_78 [16];
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = &this->currentTest;
  _Var2._M_head_impl =
       (TestName *)
       operator_new(0x58,
                    "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h"
                    ,0x31);
  *(undefined8 *)
   &((_Var2._M_head_impl)->sections).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl = 0;
  *(pointer *)
   ((long)&((_Var2._M_head_impl)->sections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((_Var2._M_head_impl)->sections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl + 0x10) = (pointer)0x0;
  ((_Var2._M_head_impl)->fileName)._M_dataplus._M_p =
       (pointer)&((_Var2._M_head_impl)->fileName).field_2;
  ((_Var2._M_head_impl)->fileName)._M_string_length = 0;
  ((_Var2._M_head_impl)->fileName).field_2._M_local_buf[0] = '\0';
  ((_Var2._M_head_impl)->originalFileName)._M_dataplus._M_p =
       (pointer)&((_Var2._M_head_impl)->originalFileName).field_2;
  ((_Var2._M_head_impl)->originalFileName)._M_string_length = 0;
  ((_Var2._M_head_impl)->originalFileName).field_2._M_local_buf[0] = '\0';
  __ptr = (this->currentTest)._M_t.
          super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
          ._M_t.
          super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
          .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  (this->currentTest)._M_t.
  super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>._M_t
  .super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>.
  super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (__ptr != (TestName *)0x0) {
    ::std::default_delete<ApprovalTests::TestName>::operator()
              ((default_delete<ApprovalTests::TestName> *)this_00,__ptr);
    _Var2._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
         ._M_t.
         super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
         .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  }
  UtestShell::getFile((UtestShell *)local_78);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_78);
  ::std::__cxx11::string::string((string *)(local_78 + 0x10),pcVar3,&local_79);
  TestName::setFileName(_Var2._M_head_impl,(string *)(local_78 + 0x10));
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  SimpleString::~SimpleString((SimpleString *)local_78);
  _Var2._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
       ._M_t.
       super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
       .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  UtestShell::getGroup((UtestShell *)local_78);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_78);
  ::std::__cxx11::string::string((string *)(local_78 + 0x10),pcVar3,&local_79);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)_Var2._M_head_impl
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 0x10)
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  SimpleString::~SimpleString((SimpleString *)local_78);
  _Var2._M_head_impl =
       (this_00->_M_t).
       super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
       ._M_t.
       super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
       .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl;
  UtestShell::getName((UtestShell *)local_78);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_78);
  ::std::__cxx11::string::string((string *)(local_78 + 0x10),pcVar3,&local_79);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)_Var2._M_head_impl
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 0x10)
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  SimpleString::~SimpleString((SimpleString *)local_78);
  FrameworkIntegrations::setCurrentTest
            ((this_00->_M_t).
             super___uniq_ptr_impl<ApprovalTests::TestName,_std::default_delete<ApprovalTests::TestName>_>
             ._M_t.
             super__Tuple_impl<0UL,_ApprovalTests::TestName_*,_std::default_delete<ApprovalTests::TestName>_>
             .super__Head_base<0UL,_ApprovalTests::TestName_*,_false>._M_head_impl);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h:57:17)>
             ::_M_invoke;
  local_38 = ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/cpputest/CppUTestApprovals.h:57:17)>
             ::_M_manager;
  FrameworkIntegrations::setTestPassedNotification((TestPassedNotification *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void preTestAction(UtestShell& shell, TestResult& result) override
        {
            currentTest.reset(new ApprovalTests::TestName);
            currentTest->setFileName(cppUTestToString(shell.getFile()));

            currentTest->sections.emplace_back(cppUTestToString(shell.getGroup()));
            currentTest->sections.emplace_back(cppUTestToString(shell.getName()));

            ApprovalTests::FrameworkIntegrations::setCurrentTest(currentTest.get());
            ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                []() { CHECK_TRUE(true); });
            TestPlugin::preTestAction(shell, result);
        }